

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3c5a8::logical_combination<((anonymous_namespace)::logical_combination_types)0>::
validate(logical_combination<((anonymous_namespace)::logical_combination_types)0> *this,
        json_pointer *ptr,json *instance,json_patch *patch,error_handler *e)

{
  pointer psVar1;
  long *plVar2;
  size_type sVar3;
  size_type __new_size;
  vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  *this_00;
  ulong __val;
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  logical_combination_error_handler esub;
  logical_combination_error_handler error_summary;
  string local_f0;
  long local_d0;
  json_pointer *local_c8;
  json *local_c0;
  logical_combination<((anonymous_namespace)::logical_combination_types)0> *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  logical_combination_error_handler local_50;
  
  local_50.super_error_handler._vptr_error_handler =
       (_func_int **)&PTR__logical_combination_error_handler_00151808;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_50.error_entry_list_.
  super__Vector_base<(anonymous_namespace)::logical_combination_error_handler::error_entry,_std::allocator<(anonymous_namespace)::logical_combination_error_handler::error_entry>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  __val = 0;
  local_d0 = 0;
  local_c8 = ptr;
  local_c0 = instance;
  local_b8 = this;
  do {
    psVar1 = (local_b8->subschemata_).
             super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_b8->subschemata_).
                      super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)psVar1 >> 4) <= __val) {
      if (local_d0 == 0) {
        std::operator+(&local_70,
                       "no subschema has succeeded, but one of them is required to validate. Type: "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (anonymous_namespace)::
                        logical_combination<((anonymous_namespace)::logical_combination_types)0>::
                        key_abi_cxx11_);
        std::operator+(&local_b0,&local_70,", number of failed subschemas: ");
        std::__cxx11::to_string
                  (&local_f0,
                   (long)(local_b8->subschemata_).
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(local_b8->subschemata_).
                         super__Vector_base<std::shared_ptr<(anonymous_namespace)::schema>,_std::allocator<std::shared_ptr<(anonymous_namespace)::schema>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 4);
        std::operator+(&local_90,&local_b0,&local_f0);
        (*e->_vptr_error_handler[2])(e,local_c8,local_c0,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        std::operator+(&local_b0,"[combination: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (anonymous_namespace)::
                       logical_combination<((anonymous_namespace)::logical_combination_types)0>::
                       key_abi_cxx11_);
        std::operator+(&local_90,&local_b0," / ");
        logical_combination_error_handler::propagate(&local_50,e,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      break;
    }
    local_f0._M_dataplus._M_p = (pointer)&PTR__logical_combination_error_handler_00151808;
    local_f0._M_string_length = 0;
    local_f0.field_2._M_allocated_capacity = 0;
    local_f0.field_2._8_8_ = 0;
    __new_size = nlohmann::json_abi_v3_11_2::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 ::size(&patch->j_);
    plVar2 = *(long **)((long)&(psVar1->
                               super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>
                               )._M_ptr + lVar6);
    (**(code **)(*plVar2 + 0x18))(plVar2,local_c8,local_c0,patch,&local_f0);
    if (local_f0._M_string_length == local_f0.field_2._M_allocated_capacity) {
      local_d0 = local_d0 + 1;
      uVar4 = local_f0._M_string_length;
      uVar5 = local_f0._M_string_length;
    }
    else {
      this_00 = nlohmann::json_abi_v3_11_2::
                basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                ::
                get_ref_impl<std::vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>&,nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                          (&patch->j_);
      std::
      vector<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
      ::resize(this_00,__new_size);
      std::__cxx11::to_string(&local_70,__val);
      std::operator+(&local_b0,"case#",&local_70);
      std::operator+(&local_90,&local_b0,"] ");
      logical_combination_error_handler::propagate
                ((logical_combination_error_handler *)&local_f0,&local_50.super_error_handler,
                 &local_90);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      sVar3 = local_f0._M_string_length;
      uVar4 = local_f0.field_2._M_allocated_capacity;
      uVar5 = local_f0.field_2._M_allocated_capacity;
      if (local_f0._M_string_length != local_f0.field_2._M_allocated_capacity) {
        std::operator+(&local_90,
                       "at least one subschema has failed, but all of them are required to validate - "
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (local_f0._M_string_length + 0x28));
        (*e->_vptr_error_handler[2])(e,sVar3,sVar3 + 0x18,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::to_string(&local_70,__val);
        std::operator+(&local_b0,"[combination: allOf / case#",&local_70);
        std::operator+(&local_90,&local_b0,"] ");
        logical_combination_error_handler::propagate
                  ((logical_combination_error_handler *)&local_f0,e,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_70);
        uVar4 = local_f0.field_2._M_allocated_capacity;
        uVar5 = local_f0._M_string_length;
      }
    }
    logical_combination_error_handler::~logical_combination_error_handler
              ((logical_combination_error_handler *)&local_f0);
    __val = __val + 1;
    lVar6 = lVar6 + 0x10;
  } while (uVar5 == uVar4);
  logical_combination_error_handler::~logical_combination_error_handler(&local_50);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &patch, error_handler &e) const final
	{
		size_t count = 0;
		logical_combination_error_handler error_summary;

		for (std::size_t index = 0; index < subschemata_.size(); ++index) {
			const std::shared_ptr<schema> &s = subschemata_[index];
			logical_combination_error_handler esub;
			auto oldPatchSize = patch.get_json().size();
			s->validate(ptr, instance, patch, esub);
			if (!esub)
				count++;
			else {
				patch.get_json().get_ref<nlohmann::json::array_t &>().resize(oldPatchSize);
				esub.propagate(error_summary, "case#" + std::to_string(index) + "] ");
			}

			if (is_validate_complete(instance, ptr, e, esub, count, index))
				return;
		}

		if (count == 0) {
			e.error(ptr, instance, "no subschema has succeeded, but one of them is required to validate. Type: " + key + ", number of failed subschemas: " + std::to_string(subschemata_.size()));
			error_summary.propagate(e, "[combination: " + key + " / ");
		}
	}